

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O3

void __thiscall amrex::TagBox::coarsen(TagBox *this,IntVect *ratio,Box *cbox)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  undefined8 uVar18;
  bool bVar19;
  DataAllocator arena;
  long lVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  char *pcVar24;
  char *pcVar25;
  char *pcVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  bool bVar36;
  TagBox cfab;
  Elixir eli;
  long local_1b0;
  char *local_1a0;
  long local_198;
  char *local_190;
  BaseFab<char> local_90;
  Elixir local_48;
  
  local_1a0 = (this->super_BaseFab<char>).dptr;
  iVar4 = (this->super_BaseFab<char>).domain.smallend.vect[0];
  iVar5 = (this->super_BaseFab<char>).domain.smallend.vect[1];
  iVar6 = (this->super_BaseFab<char>).domain.smallend.vect[2];
  iVar7 = (this->super_BaseFab<char>).domain.bigend.vect[0];
  iVar8 = (this->super_BaseFab<char>).domain.bigend.vect[1];
  local_90.super_DataAllocator.m_arena = The_Arena();
  local_90._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0080d958;
  local_90.dptr = (char *)0x0;
  local_90.domain.smallend.vect._0_8_ = *(undefined8 *)(cbox->smallend).vect;
  uVar2 = *(undefined8 *)(cbox->bigend).vect;
  local_90.domain._20_8_ = *(undefined8 *)((cbox->bigend).vect + 2);
  local_90.domain.smallend.vect[2] = (int)*(undefined8 *)((cbox->smallend).vect + 2);
  local_90.domain.bigend.vect[0] = (int)uVar2;
  local_90.domain.bigend.vect[1] = (int)((ulong)uVar2 >> 0x20);
  local_90.nvar = 1;
  local_90.truesize = 0;
  local_90.ptr_owner = false;
  local_90.shared_memory = false;
  BaseFab<char>::define(&local_90);
  local_90._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0080d898;
  arena.m_arena = local_90.super_DataAllocator.m_arena;
  if (local_90.super_DataAllocator.m_arena == (Arena *)0x0) {
    arena.m_arena = The_Arena();
  }
  Gpu::Elixir::Elixir(&local_48,(void *)0x0,arena.m_arena);
  iVar9 = (cbox->smallend).vect[2];
  local_1b0 = (long)iVar9;
  iVar10 = (cbox->bigend).vect[2];
  if (iVar9 <= iVar10) {
    lVar23 = (long)((iVar7 - iVar4) + 1);
    lVar27 = (long)((iVar8 - iVar5) + 1);
    uVar11 = ratio->vect[2];
    uVar12 = ratio->vect[0];
    uVar13 = ratio->vect[1];
    iVar7 = (cbox->smallend).vect[1];
    iVar8 = (cbox->smallend).vect[0];
    lVar32 = (long)(int)uVar13;
    lVar33 = (long)(int)uVar11;
    lVar30 = (long)(int)uVar12;
    lVar35 = iVar8 * lVar30;
    local_1a0 = local_1a0 +
                (((((local_1b0 * lVar33 - (long)iVar6) * lVar27 + iVar7 * lVar32) - (long)iVar5) *
                  lVar23 + lVar35) - (long)iVar4);
    lVar20 = (long)((local_90.domain.bigend.vect[0] - local_90.domain.smallend.vect[0]) + 1);
    lVar27 = lVar27 * lVar23;
    iVar4 = (cbox->bigend).vect[0];
    iVar5 = (cbox->bigend).vect[1];
    iVar6 = (this->super_BaseFab<char>).domain.bigend.vect[2];
    iVar9 = (this->super_BaseFab<char>).domain.bigend.vect[1];
    iVar14 = (this->super_BaseFab<char>).domain.bigend.vect[0];
    iVar15 = (this->super_BaseFab<char>).domain.smallend.vect[2];
    iVar16 = (this->super_BaseFab<char>).domain.smallend.vect[1];
    iVar17 = (this->super_BaseFab<char>).domain.smallend.vect[0];
    do {
      if (iVar7 <= iVar5) {
        local_190 = local_1a0;
        local_198 = (long)iVar7;
        do {
          if (iVar8 <= iVar4) {
            pcVar26 = local_190;
            lVar29 = (long)iVar8;
            lVar34 = lVar35;
            do {
              if ((int)uVar11 < 1) {
                bVar36 = false;
              }
              else {
                uVar28 = 0;
                bVar36 = false;
                pcVar25 = pcVar26;
                do {
                  if (0 < (int)uVar13) {
                    lVar1 = uVar28 + local_1b0 * lVar33;
                    uVar22 = 0;
                    pcVar24 = pcVar25;
                    do {
                      if (0 < (int)uVar12) {
                        lVar21 = local_198 * lVar32 + uVar22;
                        uVar31 = 0;
                        do {
                          if (((((long)iVar17 <= (long)(lVar34 + uVar31)) && (iVar16 <= lVar21)) &&
                              (iVar15 <= lVar1)) &&
                             ((((long)(lVar34 + uVar31) <= (long)iVar14 && (lVar21 <= iVar9)) &&
                              ((lVar1 <= iVar6 && (bVar19 = !bVar36, bVar36 = true, bVar19)))))) {
                            bVar36 = pcVar24[uVar31] != '\0';
                          }
                          uVar31 = uVar31 + 1;
                        } while (uVar12 != uVar31);
                      }
                      uVar22 = uVar22 + 1;
                      pcVar24 = pcVar24 + lVar23;
                    } while (uVar22 != uVar13);
                  }
                  uVar28 = uVar28 + 1;
                  pcVar25 = pcVar25 + lVar27;
                } while (uVar28 != uVar11);
              }
              local_90.dptr
              [(lVar29 - local_90.domain.smallend.vect[0]) +
               (local_198 - local_90.domain.smallend.vect[1]) * lVar20 +
               (local_1b0 - local_90.domain.smallend.vect[2]) *
               ((local_90.domain.bigend.vect[1] - local_90.domain.smallend.vect[1]) + 1) * lVar20] =
                   bVar36;
              lVar29 = lVar29 + 1;
              lVar34 = lVar34 + lVar30;
              pcVar26 = pcVar26 + lVar30;
            } while (iVar4 + 1 != (int)lVar29);
          }
          local_198 = local_198 + 1;
          local_190 = local_190 + lVar32 * lVar23;
        } while (iVar5 + 1 != (int)local_198);
      }
      local_1b0 = local_1b0 + 1;
      local_1a0 = local_1a0 + lVar27 * lVar33;
    } while (iVar10 + 1 != (int)local_1b0);
  }
  pcVar26 = BaseFab<char>::dataPtr(&this->super_BaseFab<char>,0);
  uVar2 = *(undefined8 *)(cbox->bigend).vect;
  uVar3 = *(undefined8 *)(cbox->smallend).vect;
  memcpy(pcVar26,local_90.dptr,
         (long)(((cbox->bigend).vect[2] - (cbox->smallend).vect[2]) + 1) *
         (long)(((int)uVar2 - (int)uVar3) + 1) *
         (long)(((int)((ulong)uVar2 >> 0x20) - (int)((ulong)uVar3 >> 0x20)) + 1));
  uVar2 = *(undefined8 *)((cbox->smallend).vect + 2);
  uVar3 = *(undefined8 *)(cbox->bigend).vect;
  uVar18 = *(undefined8 *)((cbox->bigend).vect + 2);
  *(undefined8 *)(this->super_BaseFab<char>).domain.smallend.vect =
       *(undefined8 *)(cbox->smallend).vect;
  *(undefined8 *)((this->super_BaseFab<char>).domain.smallend.vect + 2) = uVar2;
  *(undefined8 *)(this->super_BaseFab<char>).domain.bigend.vect = uVar3;
  *(undefined8 *)((this->super_BaseFab<char>).domain.bigend.vect + 2) = uVar18;
  Gpu::Elixir::~Elixir(&local_48);
  local_90._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0080d958;
  BaseFab<char>::clear(&local_90);
  return;
}

Assistant:

void
TagBox::coarsen (const IntVect& ratio, const Box& cbox) noexcept
{
    BL_ASSERT(nComp() == 1);
    Array4<char const> const& farr = this->const_array();

    TagBox cfab(cbox, 1, The_Arena());
    Elixir eli = cfab.elixir();
    Array4<char> const& carr = cfab.array();

    Box fdomain = domain;
    Dim3 r{1,1,1};
    AMREX_D_TERM(r.x = ratio[0];, r.y = ratio[1];, r.z = ratio[2]);

    AMREX_HOST_DEVICE_FOR_3D(cbox, i, j, k,
    {
        TagType t = TagBox::CLEAR;
        for (int koff = 0; koff < r.z; ++koff) {
            int kk = k*r.z + koff;
            for (int joff = 0; joff < r.y; ++joff) {
                int jj = j*r.y + joff;
                for (int ioff = 0; ioff < r.x; ++ioff) {
                    int ii = i*r.x + ioff;
                    if (fdomain.contains(IntVect(AMREX_D_DECL(ii,jj,kk)))) {
                        t = t || farr(ii,jj,kk);
                    }
                }
            }
        }
        carr(i,j,k) = t;
    });

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        Gpu::dtod_memcpy_async(this->dataPtr(), cfab.dataPtr(), sizeof(TagType)*cbox.numPts());
    } else
#endif
    {
        std::memcpy(this->dataPtr(), cfab.dataPtr(), sizeof(TagType)*cbox.numPts());
    }
    this->domain = cbox;
}